

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flic.cc
# Opt level: O1

void __thiscall Flic::readLc(Flic *this,FlicHeader *header,FlicFrame *frame,istream *is)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong __n;
  ushort local_3c;
  short local_3a;
  uint local_38;
  uint16_t lines;
  int16_t lineSkip;
  uint8_t pixelSkip;
  char count;
  
  uVar1 = header->depth >> 3;
  uVar12 = (uint)uVar1;
  memcpy(frame->pixels,
         (this->frames_).super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].pixels,
         (ulong)((uint)header->height * (uint)header->width * uVar12));
  std::istream::read((char *)is,(long)&local_3c);
  if (local_3c != 0) {
    __n = (ulong)uVar1;
    iVar6 = 0;
    local_38 = 0;
    do {
      std::istream::read((char *)is,(long)&local_3a);
      iVar11 = (int)local_3a;
      if (local_3a < 0) {
        local_38 = local_38 - iVar11;
      }
      else {
        if (local_3a != 0) {
          uVar2 = ~local_38;
          iVar3 = 0;
          iVar9 = 0;
          do {
            std::istream::read((char *)is,(long)&lineSkip);
            uVar7 = (uint)(byte)lineSkip;
            iVar8 = (uint)header->width * (header->height + uVar2) + uVar7 + iVar9;
            std::istream::read((char *)is,(long)&lineSkip + 1);
            if (lineSkip._1_1_ < '\0') {
              pvVar5 = operator_new__(__n);
              std::istream::read((char *)is,(long)pvVar5);
              iVar4 = (int)lineSkip._1_1_;
              if (lineSkip._1_1_ < '\0') {
                lVar10 = (long)(int)(iVar8 * uVar12);
                lVar13 = 0;
                do {
                  memcpy(frame->pixels + lVar10,pvVar5,__n);
                  lVar13 = lVar13 + 1;
                  iVar4 = (int)lineSkip._1_1_;
                  lVar10 = lVar10 + __n;
                } while (SBORROW8(lVar13,-(long)iVar4) != lVar13 + iVar4 < 0);
              }
              iVar4 = -iVar4;
              operator_delete(pvVar5);
            }
            else {
              if ('\0' < lineSkip._1_1_) {
                lVar10 = (long)(int)(iVar8 * uVar12);
                lVar13 = 0;
                do {
                  pvVar5 = operator_new__((ulong)uVar12);
                  std::istream::read((char *)is,(long)pvVar5);
                  memcpy(frame->pixels + lVar10,pvVar5,(ulong)uVar12);
                  operator_delete(pvVar5);
                  lVar13 = lVar13 + 1;
                  lVar10 = lVar10 + __n;
                } while (lVar13 < lineSkip._1_1_);
              }
              iVar4 = (int)lineSkip._1_1_;
            }
            iVar9 = uVar7 + iVar9 + iVar4;
            iVar3 = iVar3 + 1;
          } while (iVar3 != iVar11);
        }
        local_38 = local_38 + 1;
        iVar6 = iVar6 + 1;
      }
    } while (iVar6 < (int)(uint)local_3c);
  }
  return;
}

Assistant:

void Flic::readLc(const FlicHeader &header, FlicFrame &frame, std::istream &is) {
	int bytespp = header.depth / 8;
	memcpy(frame.pixels, frames_.back().pixels, header.width * header.height * bytespp);
	uint16_t lines;
	is.read((char*)&lines, 2);
	int j = 0, y = 0;
	while (j < lines) {
		int16_t lineSkip;
		is.read(reinterpret_cast<char*>(&lineSkip), 2);
		if (lineSkip < 0) {
			y += -lineSkip;
			continue;
		} else {
			int packets = lineSkip;
			int x = 0;
			for (int k = 0; k < packets; ++k) {
				uint8_t pixelSkip;
				is.read((char*)&pixelSkip, 1);
				x += pixelSkip;
				int offset = ((header.height - y - 1) * header.width + x) * bytespp;
				char count;
				is.read(&count, 1);
				if (count < 0) {
					char *tmp = new char[bytespp];
					is.read(tmp, bytespp);
					for (int j = 0; j < -count; ++j) {
						memcpy(frame.pixels + offset + j * bytespp, tmp, bytespp);
					}
					x += -count;
					delete tmp;
				} else {
					for (int j = 0; j < count; ++j) {
						char *tmp = new char[bytespp];
						is.read(tmp, bytespp);
						memcpy(frame.pixels + offset + j * bytespp, tmp, bytespp);
						delete tmp;
					}
					x += count;
				}
			}
			++y;
		}
		++j;
	}
}